

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::classifyChannels
          (DwaCompressor *this,ChannelList *channels,
          vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *chanData,
          vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
          *cscData)

{
  PixelType PVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Channel *pCVar5;
  reference pvVar6;
  pointer pCVar7;
  mapped_type *pmVar8;
  reference ppVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *in_RCX;
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  *in_RDX;
  size_t numCsc;
  int blu;
  int grn;
  int red;
  iterator theItem;
  iterator i;
  CscChannelSet tmpSet;
  iterator theSet;
  size_t lastDot;
  string suffix;
  string prefix;
  Iterator c_1;
  uint offset;
  Iterator c;
  uint numChan;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  tmpCscSet;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  prefixMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  *in_stack_fffffffffffffd28;
  __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
  *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int iVar13;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd60;
  CompressorScheme in_stack_fffffffffffffd64;
  pointer in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  Classifier *in_stack_fffffffffffffd78;
  _Self local_1c0;
  _Self local_1b8;
  Classifier *local_1b0;
  __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
  local_1a8;
  undefined4 local_19c;
  undefined4 uStack_198;
  undefined4 local_194;
  _Self local_190;
  _Self local_188;
  string local_180 [32];
  string local_160 [32];
  long local_140;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  iterator local_c8;
  iterator local_b0;
  uint local_a4;
  iterator local_a0;
  iterator local_78;
  uint local_6c;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  local_68 [3];
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *local_20;
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
         *)0x16d5cc);
  std::
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ::vector((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
            *)0x16d5d9);
  local_6c = 0;
  local_78._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_fffffffffffffd28);
  while( true ) {
    ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffd30,(Iterator *)in_stack_fffffffffffffd28);
    local_a0._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_fffffffffffffd28);
    ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffd30,(Iterator *)in_stack_fffffffffffffd28);
    bVar4 = Imf_2_5::operator!=((ConstIterator *)in_stack_fffffffffffffd30,
                                (ConstIterator *)in_stack_fffffffffffffd28);
    if (!bVar4) break;
    local_6c = local_6c + 1;
    ChannelList::Iterator::operator++((Iterator *)in_stack_fffffffffffffd30);
  }
  if (local_6c != 0) {
    std::
    vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
    ::resize((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  local_a4 = 0;
  local_b0._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_fffffffffffffd28);
  while( true ) {
    ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffd30,(Iterator *)in_stack_fffffffffffffd28);
    local_c8._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_fffffffffffffd28);
    ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffd30,(Iterator *)in_stack_fffffffffffffd28);
    bVar4 = Imf_2_5::operator!=((ConstIterator *)in_stack_fffffffffffffd30,
                                (ConstIterator *)in_stack_fffffffffffffd28);
    if (!bVar4) break;
    ChannelList::Iterator::name((Iterator *)0x16d7af);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    std::__cxx11::string::operator=((string *)pvVar6,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    pvVar6->compression = UNKNOWN;
    pCVar5 = ChannelList::Iterator::channel((Iterator *)0x16d85f);
    iVar13 = pCVar5->xSampling;
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    pvVar6->xSampling = iVar13;
    pCVar5 = ChannelList::Iterator::channel((Iterator *)0x16d8a8);
    iVar13 = pCVar5->ySampling;
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    pvVar6->ySampling = iVar13;
    pCVar5 = ChannelList::Iterator::channel((Iterator *)0x16d8f1);
    PVar1 = pCVar5->type;
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    pvVar6->type = PVar1;
    pCVar5 = ChannelList::Iterator::channel((Iterator *)0x16d933);
    bVar4 = pCVar5->pLinear;
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    pvVar6->pLinear = (bool)(bVar4 & 1);
    local_a4 = local_a4 + 1;
    ChannelList::Iterator::operator++((Iterator *)in_stack_fffffffffffffd30);
  }
  for (local_a4 = 0; local_a4 < local_6c; local_a4 = local_a4 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (char *)in_stack_fffffffffffffd68,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::allocator<char>::~allocator(&local_111);
    pvVar6 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[](local_18,(ulong)local_a4);
    std::__cxx11::string::string(local_138,(string *)pvVar6);
    local_140 = std::__cxx11::string::find_last_of((char)local_138,0x2e);
    if (local_140 != -1) {
      std::__cxx11::string::substr((ulong)local_160,(ulong)local_138);
      std::__cxx11::string::operator=(local_110,local_160);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::substr((ulong)local_180,(ulong)local_138);
      std::__cxx11::string::operator=(local_138,local_180);
      std::__cxx11::string::~string(local_180);
    }
    local_188._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
         ::find(in_stack_fffffffffffffd28,(key_type *)0x16db70);
    local_190._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
         ::end(in_stack_fffffffffffffd28);
    bVar4 = std::operator==(&local_188,&local_190);
    if (bVar4) {
      local_194 = 0xffffffff;
      uStack_198 = 0xffffffff;
      local_19c = 0xffffffff;
      in_stack_fffffffffffffd78 =
           (Classifier *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                         *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                        &in_stack_fffffffffffffd68->_suffix);
      *(ulong *)&in_stack_fffffffffffffd78->_suffix = CONCAT44(uStack_198,local_19c);
      *(undefined4 *)&(in_stack_fffffffffffffd78->_suffix)._M_string_length = local_194;
    }
    local_1a8._M_current =
         (Classifier *)
         std::
         vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
         ::begin((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                  *)in_stack_fffffffffffffd28);
    while( true ) {
      local_1b0 = (Classifier *)
                  std::
                  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                  ::end((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                         *)in_stack_fffffffffffffd28);
      bVar4 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffd30,
                         (__normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar4) break;
      in_stack_fffffffffffffd68 =
           __gnu_cxx::
           __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
           ::operator->(&local_1a8);
      std::
      vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ::operator[](local_18,(ulong)local_a4);
      in_stack_fffffffffffffd77 =
           Classifier::match(in_stack_fffffffffffffd78,
                             (string *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70)
                             ,(PixelType)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      if ((bool)in_stack_fffffffffffffd77) {
        pCVar7 = __gnu_cxx::
                 __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
                 ::operator->(&local_1a8);
        in_stack_fffffffffffffd64 = pCVar7->_scheme;
        pvVar6 = std::
                 vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                 ::operator[](local_18,(ulong)local_a4);
        pvVar6->compression = in_stack_fffffffffffffd64;
        pCVar7 = __gnu_cxx::
                 __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
                 ::operator->(&local_1a8);
        if (-1 < pCVar7->_cscIdx) {
          in_stack_fffffffffffffd54 = local_a4;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                                &in_stack_fffffffffffffd68->_suffix);
          pCVar7 = __gnu_cxx::
                   __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
                   ::operator->(&local_1a8);
          pmVar8->idx[pCVar7->_cscIdx] = in_stack_fffffffffffffd54;
        }
      }
      __gnu_cxx::
      __normal_iterator<Imf_2_5::DwaCompressor::Classifier_*,_std::vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>_>
      ::operator++(&local_1a8);
    }
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_110);
  }
  local_1b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
       ::begin(in_stack_fffffffffffffd28);
  while( true ) {
    local_1c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
         ::end(in_stack_fffffffffffffd28);
    bVar4 = std::operator!=(&local_1b8,&local_1c0);
    if (!bVar4) break;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
                          *)0x16dde9);
    iVar13 = (ppVar9->second).idx[0];
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
                          *)0x16de00);
    iVar2 = (ppVar9->second).idx[1];
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
                          *)0x16de17);
    iVar3 = (ppVar9->second).idx[2];
    if (((-1 < iVar13) && (-1 < iVar2)) && (-1 < iVar3)) {
      pvVar6 = std::
               vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               ::operator[](local_18,(long)iVar13);
      in_stack_fffffffffffffd50 = pvVar6->xSampling;
      pvVar6 = std::
               vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               ::operator[](local_18,(long)iVar2);
      if (in_stack_fffffffffffffd50 == pvVar6->xSampling) {
        pvVar6 = std::
                 vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                 ::operator[](local_18,(long)iVar13);
        in_stack_fffffffffffffd4c = pvVar6->xSampling;
        pvVar6 = std::
                 vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                 ::operator[](local_18,(long)iVar3);
        if (in_stack_fffffffffffffd4c == pvVar6->xSampling) {
          pvVar6 = std::
                   vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                   ::operator[](local_18,(long)iVar2);
          in_stack_fffffffffffffd48 = pvVar6->xSampling;
          pvVar6 = std::
                   vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                   ::operator[](local_18,(long)iVar3);
          if (in_stack_fffffffffffffd48 == pvVar6->xSampling) {
            pvVar6 = std::
                     vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                     ::operator[](local_18,(long)iVar13);
            in_stack_fffffffffffffd44 = pvVar6->ySampling;
            pvVar6 = std::
                     vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                     ::operator[](local_18,(long)iVar2);
            if (in_stack_fffffffffffffd44 == pvVar6->ySampling) {
              pvVar6 = std::
                       vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                       ::operator[](local_18,(long)iVar13);
              in_stack_fffffffffffffd40 = pvVar6->ySampling;
              pvVar6 = std::
                       vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                       ::operator[](local_18,(long)iVar3);
              if (in_stack_fffffffffffffd40 == pvVar6->ySampling) {
                pvVar6 = std::
                         vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                         ::operator[](local_18,(long)iVar2);
                iVar13 = pvVar6->ySampling;
                pvVar6 = std::
                         vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                         ::operator[](local_18,(long)iVar3);
                if (iVar13 == pvVar6->ySampling) {
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
                               *)0x16dfcd);
                  std::
                  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                  ::push_back((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                               *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                              (value_type *)CONCAT44(iVar13,in_stack_fffffffffffffd38));
                }
              }
            }
          }
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>
                  *)in_stack_fffffffffffffd30);
  }
  sVar10 = std::
           vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
           ::size(local_68);
  if (sVar10 != 0) {
    std::
    vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::resize((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  for (local_a4 = 0; local_a4 < sVar10; local_a4 = local_a4 + 1) {
    pvVar11 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](local_68,(ulong)local_a4);
    pvVar12 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](local_20,(ulong)local_a4);
    *(undefined8 *)pvVar12->idx = *(undefined8 *)pvVar11->idx;
    pvVar12->idx[2] = pvVar11->idx[2];
  }
  std::
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  ::~vector((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
             *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DwaCompressor::CscChannelSet>_>_>
          *)0x16e0bb);
  return;
}

Assistant:

void
DwaCompressor::classifyChannels
    (ChannelList channels,
     std::vector<ChannelData> &chanData,
     std::vector<CscChannelSet> &cscData)
{
    //
    // prefixMap used to map channel name prefixes to 
    // potential CSC-able sets of channels.
    //

    std::map<std::string, DwaCompressor::CscChannelSet> prefixMap;
    std::vector<DwaCompressor::CscChannelSet>           tmpCscSet;

    unsigned int numChan = 0;

    for (ChannelList::Iterator c = channels.begin(); c != channels.end(); ++c)
        numChan++;
    
    if (numChan)
        chanData.resize (numChan);

    //
    // Cache the relevant data from the channel structs.
    //

    unsigned int offset = 0;

    for (ChannelList::Iterator c = channels.begin(); c != channels.end(); ++c)
    {
        chanData[offset].name        = std::string (c.name());
        chanData[offset].compression = UNKNOWN;
        chanData[offset].xSampling   = c.channel().xSampling;
        chanData[offset].ySampling   = c.channel().ySampling;
        chanData[offset].type        = c.channel().type;
        chanData[offset].pLinear     = c.channel().pLinear;

        offset++;
    }

    //
    // Try and figure out which channels should be
    // compressed by which means.
    //

    for (offset = 0; offset<numChan; ++offset)
    {
        std::string prefix  = "";
        std::string suffix  = chanData[offset].name;
        size_t      lastDot = suffix.find_last_of ('.');

        if (lastDot != std::string::npos)
        {
            prefix = suffix.substr (0,         lastDot);
            suffix = suffix.substr (lastDot+1, std::string::npos);
        } 

        //
        // Make sure we have an entry in our CSC set map 
        //

        std::map<std::string, DwaCompressor::CscChannelSet>::iterator 
            theSet = prefixMap.find (prefix);

        if (theSet == prefixMap.end())
        {
            DwaCompressor::CscChannelSet tmpSet;

            tmpSet.idx[0] = 
            tmpSet.idx[1] = 
            tmpSet.idx[2] = -1;

            prefixMap[prefix] = tmpSet;
        }

        // 
        // Check the suffix against the list of classifications
        // we defined previously. If the _cscIdx is not negative,
        // it indicates that we should be part of a CSC group.
        //

        for (std::vector<Classifier>::iterator i = _channelRules.begin();
             i != _channelRules.end();
             ++i)
        {
            if ( i->match(suffix, chanData[offset].type) )
            {
                chanData[offset].compression = i->_scheme;

                if ( i->_cscIdx >= 0)
                    prefixMap[prefix].idx[i->_cscIdx] = offset;
            }
        }
    }

    //
    // Finally, try and find RGB sets of channels which 
    // can be CSC'ed to a Y'CbCr space prior to loss, for
    // better compression.
    //
    // Walk over our set of candidates, and see who has
    // all three channels defined (and has common sampling
    // patterns, etc).
    //

    for (std::map<std::string, DwaCompressor::CscChannelSet>::iterator 
         theItem = prefixMap.begin(); theItem != prefixMap.end();
         ++theItem)
    {
        int red = (*theItem).second.idx[0];
        int grn = (*theItem).second.idx[1];
        int blu = (*theItem).second.idx[2];

        if ((red < 0) || (grn < 0) || (blu < 0))
            continue;

        if ((chanData[red].xSampling != chanData[grn].xSampling) ||
            (chanData[red].xSampling != chanData[blu].xSampling) ||
            (chanData[grn].xSampling != chanData[blu].xSampling) ||
            (chanData[red].ySampling != chanData[grn].ySampling) ||
            (chanData[red].ySampling != chanData[blu].ySampling) ||
            (chanData[grn].ySampling != chanData[blu].ySampling))
        {
            continue;
        }
        
        tmpCscSet.push_back ((*theItem).second);
    }
    
    size_t numCsc = tmpCscSet.size();

    if (numCsc)
        cscData.resize(numCsc);

    for (offset = 0; offset < numCsc; ++offset)
        cscData[offset] = tmpCscSet[offset];
}